

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::ScopedProperty2
          (ByteCodeWriter *this,OpCode op,RegSlot value,PropertyIdIndexType propertyIdIndex,
          RegSlot value2)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_24;
  RegSlot RStack_20;
  bool success;
  PropertyIdIndexType local_1c;
  RegSlot value2_local;
  PropertyIdIndexType propertyIdIndex_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  RStack_20 = value2;
  local_1c = propertyIdIndex;
  value2_local = value;
  propertyIdIndex_local._2_2_ = op;
  _value_local = this;
  CheckOpen(this);
  op_00 = propertyIdIndex_local._2_2_;
  OpLayoutType::OpLayoutType(&local_24,ElementScopedC2);
  CheckOp(this,op_00,local_24);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(propertyIdIndex_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8cd,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  value2_local = ConsumeReg(this,value2_local);
  RStack_20 = ConsumeReg(this,RStack_20);
  if (propertyIdIndex_local._2_2_ != ScopedLdInst) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8d8,"(false)",
                                "The specified OpCode is not intended for field-access with a second instance"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TryWriteElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,propertyIdIndex_local._2_2_,value2_local,local_1c,RStack_20);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,propertyIdIndex_local._2_2_,value2_local,local_1c,RStack_20), !bVar2)
      ) && (bVar2 = TryWriteElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                              (this,propertyIdIndex_local._2_2_,value2_local,local_1c,RStack_20),
           !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8dc,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::ScopedProperty2(OpCode op, RegSlot value, PropertyIdIndexType propertyIdIndex, RegSlot value2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementScopedC2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        value2 = ConsumeReg(value2);

        switch (op)
        {
        case OpCode::ScopedLdInst:
            break;

        default:
            AssertMsg(false, "The specified OpCode is not intended for field-access with a second instance");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementScopedC2, op, value, propertyIdIndex, value2);
    }